

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineValidator.cpp
# Opt level: O0

Result * CoreML::validate(Result *__return_storage_ptr__,Model *spec,Pipeline *pipelineParams)

{
  iterator iVar1;
  bool bVar2;
  bool bVar3;
  ModelDescription *pMVar4;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *pRVar5;
  RepeatedPtrField<CoreML::Specification::Model> *this;
  reference this_00;
  reference pFVar6;
  mapped_type *ppFVar7;
  pointer ppVar8;
  Model *pMVar9;
  string *psVar10;
  string local_678;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_658;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_638;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_618;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f8;
  _Self local_5d8;
  _Self local_5d0;
  undefined1 local_5c8 [8];
  string modelName;
  undefined1 local_5a0 [4];
  int modelIdx_2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  string local_550;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_530;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_510;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0;
  int local_4ac;
  undefined1 local_4a8 [4];
  int nNames;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_488;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468;
  undefined1 local_448 [8];
  Model model_2;
  int modelIdx_1;
  string local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  undefined1 local_390 [8];
  Model model_1;
  undefined1 local_358 [4];
  int modelIdx;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>,_true>
  local_2d8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>,_true>
  local_2d0;
  iterator it_1;
  FeatureDescription *output;
  const_iterator __end1_2;
  const_iterator __begin1_2;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *__range1_2;
  FeatureDescription *arg_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *__range2_1;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *outputs;
  string local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  uint local_1b4;
  string local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>,_true>
  local_110;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>,_true>
  local_108;
  iterator it;
  FeatureDescription *arg;
  const_iterator __end2;
  const_iterator __begin2;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *__range2;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *inputs;
  Model *model;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  RepeatedPtrField<CoreML::Specification::Model> *__range1_1;
  FeatureDescription *input;
  const_iterator __end1;
  const_iterator __begin1;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *__range1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>_>_>
  typeTable;
  allocator local_49;
  string local_48;
  int local_24;
  Pipeline *pPStack_20;
  int nModels;
  Pipeline *pipelineParams_local;
  Model *spec_local;
  Result *r;
  
  pPStack_20 = pipelineParams;
  pipelineParams_local = (Pipeline *)spec;
  spec_local = (Model *)__return_storage_ptr__;
  local_24 = Specification::Pipeline::models_size(pipelineParams);
  if (local_24 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_48,"Pipeline must contain one or more models.",&local_49);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    return __return_storage_ptr__;
  }
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>_>_>
                   *)&__range1);
  pMVar4 = Specification::Model::description((Model *)pipelineParams_local);
  pRVar5 = Specification::ModelDescription::input(pMVar4);
  __end1 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::begin
                     (pRVar5);
  input = (FeatureDescription *)
          google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::end(pRVar5)
  ;
  while (bVar2 = google::protobuf::internal::
                 RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator!=
                           (&__end1,(iterator *)&input), bVar2) {
    pFVar6 = google::protobuf::internal::
             RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator*
                       (&__end1);
    psVar10 = Specification::FeatureDescription::name_abi_cxx11_(pFVar6);
    ppFVar7 = std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>_>_>
              ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>_>_>
                            *)&__range1,psVar10);
    *ppFVar7 = pFVar6;
    google::protobuf::internal::RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>
    ::operator++(&__end1);
  }
  this = Specification::Pipeline::models(pPStack_20);
  __end1_1 = google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::begin(this);
  model = (Model *)google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::end(this);
  while (bVar2 = google::protobuf::internal::RepeatedPtrIterator<const_CoreML::Specification::Model>
                 ::operator!=(&__end1_1,(iterator *)&model), bVar2) {
    this_00 = google::protobuf::internal::RepeatedPtrIterator<const_CoreML::Specification::Model>::
              operator*(&__end1_1);
    pMVar4 = Specification::Model::description(this_00);
    pRVar5 = Specification::ModelDescription::input(pMVar4);
    __end2 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::begin
                       (pRVar5);
    arg = (FeatureDescription *)
          google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::end(pRVar5)
    ;
    while (bVar2 = google::protobuf::internal::
                   RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator!=
                             (&__end2,(iterator *)&arg), bVar2) {
      it.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>,_true>
      ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>,_true>
                 )google::protobuf::internal::
                  RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator*
                            (&__end2);
      psVar10 = Specification::FeatureDescription::name_abi_cxx11_
                          ((FeatureDescription *)
                           it.
                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>,_true>
                           ._M_cur);
      local_108._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>_>_>
           ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>_>_>
                   *)&__range1,psVar10);
      local_110._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>_>_>
           ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>_>_>
                  *)&__range1);
      bVar2 = std::__detail::operator==(&local_108,&local_110);
      iVar1 = it;
      if (bVar2) {
        psVar10 = Specification::FeatureDescription::name_abi_cxx11_
                            ((FeatureDescription *)
                             it.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>,_true>
                             ._M_cur);
        std::operator+(&local_190,"Pipeline: the input \'",psVar10);
        std::operator+(&local_170,&local_190,"\' of model \'");
        pMVar4 = Specification::Model::description(this_00);
        Specification::ModelDescription::GetTypeName_abi_cxx11_(&local_1b0,pMVar4);
        std::operator+(&local_150,&local_170,&local_1b0);
        std::operator+(&local_130,&local_150,
                       "\' does not present in pipeline input or previous model.");
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_130);
        std::__cxx11::string::~string((string *)&local_130);
        std::__cxx11::string::~string((string *)&local_150);
        std::__cxx11::string::~string((string *)&local_1b0);
        std::__cxx11::string::~string((string *)&local_170);
        std::__cxx11::string::~string((string *)&local_190);
        local_1b4 = 1;
        goto LAB_009bfb8c;
      }
      ppVar8 = std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>,_false,_true>
                             *)&local_108);
      bVar2 = Specification::isEquivalent
                        ((FeatureDescription *)
                         iVar1.
                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>,_true>
                         ._M_cur,ppVar8->second);
      if (!bVar2) {
        psVar10 = Specification::FeatureDescription::name_abi_cxx11_
                            ((FeatureDescription *)
                             it.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>,_true>
                             ._M_cur);
        std::operator+(&local_258,"Pipeline: the input \'",psVar10);
        std::operator+(&local_238,&local_258,"\' of model \'");
        pMVar4 = Specification::Model::description(this_00);
        Specification::ModelDescription::GetTypeName_abi_cxx11_(&local_278,pMVar4);
        std::operator+(&local_218,&local_238,&local_278);
        std::operator+(&local_1f8,&local_218,
                       "\' does not match the type previously specified by the pipeline input or the output of a previous model."
                      );
        std::operator+(&local_1d8,&local_1f8,
                       " For the second case, make sure the input and previous model\'s output has the matching name and shapes."
                      );
        Result::Result(__return_storage_ptr__,TYPE_MISMATCH,&local_1d8);
        std::__cxx11::string::~string((string *)&local_1d8);
        std::__cxx11::string::~string((string *)&local_1f8);
        std::__cxx11::string::~string((string *)&local_218);
        std::__cxx11::string::~string((string *)&local_278);
        std::__cxx11::string::~string((string *)&local_238);
        std::__cxx11::string::~string((string *)&local_258);
        local_1b4 = 1;
        goto LAB_009bfb8c;
      }
      google::protobuf::internal::
      RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator++(&__end2);
    }
    bVar2 = false;
    Model::validate(__return_storage_ptr__,this_00);
    bVar3 = Result::good(__return_storage_ptr__);
    if (bVar3) {
      pMVar4 = Specification::Model::description(this_00);
      pRVar5 = Specification::ModelDescription::output(pMVar4);
      __end2_1 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::
                 begin(pRVar5);
      arg_1 = (FeatureDescription *)
              google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::end
                        (pRVar5);
      while (bVar3 = google::protobuf::internal::
                     RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::
                     operator!=(&__end2_1,(iterator *)&arg_1), bVar3) {
        pFVar6 = google::protobuf::internal::
                 RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator*
                           (&__end2_1);
        psVar10 = Specification::FeatureDescription::name_abi_cxx11_(pFVar6);
        ppFVar7 = std::
                  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>_>_>
                  ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>_>_>
                                *)&__range1,psVar10);
        *ppFVar7 = pFVar6;
        google::protobuf::internal::
        RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator++(&__end2_1);
      }
      local_1b4 = 0;
    }
    else {
      bVar2 = true;
      local_1b4 = 1;
    }
    if (!bVar2) {
      Result::~Result(__return_storage_ptr__);
    }
    if (local_1b4 != 0) goto LAB_009bfb8c;
    google::protobuf::internal::RepeatedPtrIterator<const_CoreML::Specification::Model>::operator++
              (&__end1_1);
  }
  pMVar4 = Specification::Model::description((Model *)pipelineParams_local);
  pRVar5 = Specification::ModelDescription::output(pMVar4);
  __end1_2 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::begin
                       (pRVar5);
  output = (FeatureDescription *)
           google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::end
                     (pRVar5);
  while (bVar2 = google::protobuf::internal::
                 RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator!=
                           (&__end1_2,(iterator *)&output), bVar2) {
    it_1.
    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>,_true>
    ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>,_true>
               )google::protobuf::internal::
                RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator*
                          (&__end1_2);
    psVar10 = Specification::FeatureDescription::name_abi_cxx11_
                        ((FeatureDescription *)
                         it_1.
                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>,_true>
                         ._M_cur);
    local_2d0._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>_>_>
         ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>_>_>
                 *)&__range1,psVar10);
    local_2d8._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>_>_>
         ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>_>_>
                *)&__range1);
    bVar2 = std::__detail::operator==(&local_2d0,&local_2d8);
    iVar1 = it_1;
    if (bVar2) {
      psVar10 = Specification::FeatureDescription::name_abi_cxx11_
                          ((FeatureDescription *)
                           it_1.
                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>,_true>
                           ._M_cur);
      std::operator+(&local_318,"Pipeline output \'",psVar10);
      std::operator+(&local_2f8,&local_318,"\' not present in pipeline input or a contained model.")
      ;
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_2f8);
      std::__cxx11::string::~string((string *)&local_2f8);
      std::__cxx11::string::~string((string *)&local_318);
      local_1b4 = 1;
      goto LAB_009bfb8c;
    }
    ppVar8 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>,_false,_true>
                           *)&local_2d0);
    bVar2 = Specification::isEquivalent
                      ((FeatureDescription *)
                       iVar1.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>,_true>
                       ._M_cur,ppVar8->second);
    if (!bVar2) {
      psVar10 = Specification::FeatureDescription::name_abi_cxx11_
                          ((FeatureDescription *)
                           it_1.
                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>,_true>
                           ._M_cur);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358,
                     "Type of pipeline output \'",psVar10);
      std::operator+(&local_338,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358,
                     "\' does not match type produced in pipeline input.");
      Result::Result(__return_storage_ptr__,TYPE_MISMATCH,&local_338);
      std::__cxx11::string::~string((string *)&local_338);
      std::__cxx11::string::~string((string *)local_358);
      local_1b4 = 1;
      goto LAB_009bfb8c;
    }
    google::protobuf::internal::RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>
    ::operator++(&__end1_2);
  }
  bVar2 = Specification::Model::isupdatable((Model *)pipelineParams_local);
  if (bVar2) {
    for (model_1._oneof_case_[0] = 0; (int)model_1._oneof_case_[0] < local_24 + -1;
        model_1._oneof_case_[0] = model_1._oneof_case_[0] + 1) {
      pMVar9 = Specification::Pipeline::models(pPStack_20,model_1._oneof_case_[0]);
      Specification::Model::Model((Model *)local_390,pMVar9);
      bVar2 = Specification::Model::isupdatable((Model *)local_390);
      if (bVar2) {
        std::__cxx11::to_string(&local_3f0,model_1._oneof_case_[0]);
        std::operator+(&local_3d0,
                       "Only the last model in the pipeline can be updatable. Model at position \'",
                       &local_3f0);
        std::operator+(&local_3b0,&local_3d0,"\' is marked as updatable.");
        Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&local_3b0);
        std::__cxx11::string::~string((string *)&local_3b0);
        std::__cxx11::string::~string((string *)&local_3d0);
        std::__cxx11::string::~string((string *)&local_3f0);
      }
      local_1b4 = (uint)bVar2;
      Specification::Model::~Model((Model *)local_390);
      if (local_1b4 != 0) goto LAB_009bfb8c;
    }
    pMVar9 = Specification::Pipeline::models(pPStack_20,local_24 + -1);
    bVar2 = Specification::Model::isupdatable(pMVar9);
    if (!bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&modelIdx_1,
                 "Last model in an updatable pipeline model should be marked as updatable.",
                 (allocator *)((long)model_2._oneof_case_ + 3));
      Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,
                     (string *)&modelIdx_1);
      std::__cxx11::string::~string((string *)&modelIdx_1);
      std::allocator<char>::~allocator((allocator<char> *)((long)model_2._oneof_case_ + 3));
      local_1b4 = 1;
      goto LAB_009bfb8c;
    }
  }
  else {
    for (model_2._cached_size_ = 0; model_2._cached_size_ < local_24;
        model_2._cached_size_ = model_2._cached_size_ + 1) {
      pMVar9 = Specification::Pipeline::models(pPStack_20,model_2._cached_size_);
      Specification::Model::Model((Model *)local_448,pMVar9);
      bVar2 = Specification::Model::isupdatable((Model *)local_448);
      if (bVar2) {
        std::__cxx11::to_string((string *)local_4a8,model_2._cached_size_);
        std::operator+(&local_488,"Found an updatable model at \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_4a8);
        std::operator+(&local_468,&local_488,"\' inside a non-updatable pipeline.");
        Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&local_468);
        std::__cxx11::string::~string((string *)&local_468);
        std::__cxx11::string::~string((string *)&local_488);
        std::__cxx11::string::~string((string *)local_4a8);
      }
      local_1b4 = (uint)bVar2;
      Specification::Model::~Model((Model *)local_448);
      if (local_1b4 != 0) goto LAB_009bfb8c;
    }
  }
  local_4ac = Specification::Pipeline::names_size(pPStack_20);
  if (0 < local_4ac) {
    if (local_4ac != local_24) {
      std::__cxx11::to_string(&local_550,local_4ac);
      std::operator+(&local_530,"The number of pipeline model names \'",&local_550);
      std::operator+(&local_510,&local_530,"\' doesn\'t match the number of models \'");
      std::__cxx11::to_string
                ((string *)&names._M_t._M_impl.super__Rb_tree_header._M_node_count,local_24);
      std::operator+(&local_4f0,&local_510,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &names._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::operator+(&local_4d0,&local_4f0,"\'");
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_4d0);
      std::__cxx11::string::~string((string *)&local_4d0);
      std::__cxx11::string::~string((string *)&local_4f0);
      std::__cxx11::string::~string
                ((string *)&names._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::__cxx11::string::~string((string *)&local_510);
      std::__cxx11::string::~string((string *)&local_530);
      std::__cxx11::string::~string((string *)&local_550);
      local_1b4 = 1;
      goto LAB_009bfb8c;
    }
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_5a0);
    for (modelName.field_2._12_4_ = 0; (int)modelName.field_2._12_4_ < local_4ac;
        modelName.field_2._12_4_ = modelName.field_2._12_4_ + 1) {
      psVar10 = Specification::Pipeline::names_abi_cxx11_(pPStack_20,modelName.field_2._12_4_);
      std::__cxx11::string::string((string *)local_5c8,(string *)psVar10);
      local_5d0._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_5a0,(key_type *)local_5c8);
      local_5d8._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_5a0);
      bVar2 = std::operator!=(&local_5d0,&local_5d8);
      if (bVar2) {
        std::operator+(&local_658,"Pipeline model name \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_5c8);
        std::operator+(&local_638,&local_658,"\' at index \'");
        std::__cxx11::to_string(&local_678,modelName.field_2._12_4_);
        std::operator+(&local_618,&local_638,&local_678);
        std::operator+(&local_5f8,&local_618," has already been used for previous models");
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_5f8);
        std::__cxx11::string::~string((string *)&local_5f8);
        std::__cxx11::string::~string((string *)&local_618);
        std::__cxx11::string::~string((string *)&local_678);
        std::__cxx11::string::~string((string *)&local_638);
        std::__cxx11::string::~string((string *)&local_658);
      }
      else {
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_5a0,(value_type *)local_5c8);
      }
      local_1b4 = (uint)bVar2;
      std::__cxx11::string::~string((string *)local_5c8);
      if (local_1b4 != 0) goto LAB_009bfb4c;
    }
    local_1b4 = 0;
LAB_009bfb4c:
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_5a0);
    if (local_1b4 != 0) goto LAB_009bfb8c;
  }
  Result::Result(__return_storage_ptr__);
  local_1b4 = 1;
LAB_009bfb8c:
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>_>_>
  ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>_>_>
                    *)&__range1);
  return __return_storage_ptr__;
}

Assistant:

static Result validate(const Specification::Model& spec, const Specification::Pipeline& pipelineParams) {
        const int nModels = pipelineParams.models_size();
        if (nModels == 0) {
            // empty chain is not allowed
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Pipeline must contain one or more models.");
        }

        // build a type table from the list of models
        std::unordered_map<std::string, const CoreML::Specification::FeatureDescription*> typeTable;

        // First, populate the type table with the given inputs from the pipeline
        for(const auto& input : spec.description().input() ) {
            typeTable[input.name()] = &input;
        }

        // iterate over models and check the types at each one, making sure they match up with previous versions.
        for (const auto& model : pipelineParams.models()) {
            const auto& inputs = model.description().input();

            // validate current transform against previously known valid state
            for (const CoreML::Specification::FeatureDescription& arg : inputs) {

                auto it = typeTable.find(arg.name());

                if(it == typeTable.end()) {
                    return Result(ResultType::INVALID_MODEL_PARAMETERS,
                                  ("Pipeline: the input '" + arg.name() + "' of model '" + model.description().GetTypeName()
                                   + "' does not present in pipeline input or previous model."));
                }

                if(!CoreML::Specification::isEquivalent(arg, *(it->second))) {
                    return Result(ResultType::TYPE_MISMATCH,
                                  ("Pipeline: the input '" + arg.name() + "' of model '" + model.description().GetTypeName()
                                   + "' does not match the type previously specified by the pipeline input or the output of a previous model."
                                   + " For the second case, make sure the input and previous model's output has the matching name and shapes."));
                }
            }

            // validate the model itself and bail out if it's invalid
            Result r = Model::validate(model);
            if (!r.good()) { return r; }

            // Now add in the outputs of this model to the mix.
            const auto& outputs = model.description().output();
            for (const CoreML::Specification::FeatureDescription& arg : outputs) {
                typeTable[arg.name()] = &arg;
            }
        }

        // Finally, validate that the outputs of the pipeline model match what is outputted by the models.
        for(const auto& output : spec.description().output() ) {
            auto it = typeTable.find(output.name());

            if(it == typeTable.end()) {

                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                              ("Pipeline output '" + output.name() + "' not present in pipeline input or a contained model."));
            }

            if(!CoreML::Specification::isEquivalent(output, *(it->second))) {
                return Result(ResultType::TYPE_MISMATCH,
                              ("Type of pipeline output '" + output.name() + "' does not match type produced in pipeline input."));
            }
        }
        
        if (spec.isupdatable()) {
            for (int modelIdx = 0; modelIdx < nModels - 1; modelIdx++) {
                auto model = pipelineParams.models(modelIdx);
                if (model.isupdatable()) {
                    return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION,
                                  ("Only the last model in the pipeline can be updatable. Model at position '" + std::to_string(modelIdx) + "' is marked as updatable."));
                }
            }
            if (false == pipelineParams.models(nModels - 1).isupdatable()) {
                return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION,
                              ("Last model in an updatable pipeline model should be marked as updatable."));
            }
        } else {
            for (int modelIdx = 0; modelIdx < nModels; modelIdx++) {
                auto model = pipelineParams.models(modelIdx);
                if (model.isupdatable()) {
                    return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION,
                                  ("Found an updatable model at '" + std::to_string(modelIdx) + "' inside a non-updatable pipeline."));
                }
            }
        }

        const int nNames = pipelineParams.names_size();
        if (nNames > 0) {
            if (nNames != nModels) {
                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                              ("The number of pipeline model names '" + std::to_string(nNames) +
                               "' doesn't match the number of models '" + std::to_string(nModels) + "'"));
            }
            std::set<std::string> names;
            for (int modelIdx = 0; modelIdx < nNames; modelIdx++) {
                auto modelName = pipelineParams.names(modelIdx);
                if (names.find(modelName) != names.end()) {
                    return Result(ResultType::INVALID_MODEL_PARAMETERS,
                                  ("Pipeline model name '" + modelName +
                                   "' at index '" +std::to_string(modelIdx) + " has already been used for previous models"));
                }
                names.insert(modelName);
            }

        }
        // if we get here, no input of any model caused a type mismatch with
        // any other prior model in the chain, or had an independent validation
        // error on its own.
        return Result();
    }